

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O1

void Gia_ObjCollapseDeref(Gia_Man_t *p,DdManager *dd,Vec_Ptr_t *vFuncs,int Id)

{
  int *piVar1;
  
  piVar1 = p->pRefs + Id;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    if ((Id < 0) || (vFuncs->nSize <= Id)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Cudd_RecursiveDeref(dd,(DdNode *)vFuncs->pArray[(uint)Id]);
    if (vFuncs->nSize <= Id) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    vFuncs->pArray[(uint)Id] = (void *)0x0;
  }
  return;
}

Assistant:

void Gia_ObjCollapseDeref( Gia_Man_t * p, DdManager * dd, Vec_Ptr_t * vFuncs, int Id )
{
    if ( Gia_ObjRefDecId(p, Id) )
        return;
    Cudd_RecursiveDeref( dd, (DdNode *)Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrWriteEntry( vFuncs, Id, NULL );
}